

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

bool __thiscall
PSEngine::get_move_destination_coord
          (PSEngine *this,PSVector2i p_origin,ObjectMoveType p_move_type,
          PSVector2i *p_out_destination)

{
  element_type *peVar1;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  PSVector2i *local_30;
  PSVector2i *p_out_destination_local;
  PSEngine *pPStack_20;
  ObjectMoveType p_move_type_local;
  PSEngine *this_local;
  int iStack_10;
  PSVector2i p_origin_local;
  
  this_local._4_4_ = p_origin.x;
  iStack_10 = p_origin.y;
  switch(p_move_type) {
  case Up:
    iStack_10 = iStack_10 + -1;
    break;
  case Down:
    iStack_10 = iStack_10 + 1;
    break;
  case Left:
    this_local._4_4_ = this_local._4_4_ + -1;
    break;
  case Right:
    this_local._4_4_ = this_local._4_4_ + 1;
    break;
  default:
    if ((int)(this->m_config).log_verbosity < 5) {
      local_30 = p_out_destination;
      p_out_destination_local._4_4_ = p_move_type;
      pPStack_20 = this;
      unique0x100001be = p_origin;
      peVar1 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&this->m_logger);
      std::__cxx11::string::string(local_50,(string *)&m_engine_log_cat_abi_cxx11_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_70,"incorrect move type specified to PSEngine::get_move_destination_cell",
                 &local_71);
      (*peVar1->_vptr_PSLogger[2])(peVar1,4,local_50,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
      std::__cxx11::string::~string(local_50);
      if (((this->m_config).log_operation_history_after_error & 1U) != 0) {
        print_operation_history(this);
      }
    }
    return false;
  }
  if ((((this_local._4_4_ < (this->m_current_level).size.x) && (-1 < this_local._4_4_)) &&
      (iStack_10 < (this->m_current_level).size.y)) && (-1 < (long)stack0xffffffffffffffec)) {
    *p_out_destination = stack0xffffffffffffffec;
    p_origin_local.x._3_1_ = true;
  }
  else {
    p_origin_local.x._3_1_ = false;
  }
  return p_origin_local.x._3_1_;
}

Assistant:

bool PSEngine::get_move_destination_coord(PSVector2i p_origin, ObjectMoveType p_move_type, PSVector2i& p_out_destination)
{
    switch (p_move_type)
    {
        case ObjectMoveType::Up:
            p_origin.y -= 1;
            break;
        case ObjectMoveType::Down:
            p_origin.y += 1;
            break;
        case ObjectMoveType::Left:
            p_origin.x -= 1;
            break;
        case ObjectMoveType::Right:
            p_origin.x += 1;
            break;

        default:
            PS_LOG_ERROR("incorrect move type specified to PSEngine::get_move_destination_cell");
            return false;
    }

    //check for out of bounds
    if(p_origin.x >= m_current_level.size.x || p_origin.x < 0 || p_origin.y >= m_current_level.size.y || p_origin.y < 0)
    {
        //PS_LOG_ERROR("Cannot get move destination cell since the move would be out of bounds");
        return false;
    }

    p_out_destination = p_origin;
    return true;
}